

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall Imf_2_5::DwaCompressor::LossyDctEncoderBase::execute(LossyDctEncoderBase *this)

{
  value_type puVar1;
  unsigned_short *puVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference ppcVar8;
  float *pfVar9;
  reference ppuVar10;
  reference pvVar11;
  char **ppcVar12;
  int iVar13;
  long in_RDI;
  float fVar14;
  undefined8 in_XMM0_Qa;
  double dVar15;
  int i_2;
  int i_1;
  int i;
  uint chan_4;
  char *tmpConstCharPtr;
  int vy;
  int vx;
  int x_1;
  int y_1;
  uint chan_3;
  char *tmpCharPtr;
  unsigned_short tmpShortNative;
  unsigned_short tmpShortXdr;
  half h;
  int blockx;
  int blocky;
  uint chan_2;
  int x;
  char *dstXdr;
  char *srcXdr;
  float src;
  int y;
  uint chan_1;
  char *tmpHalfBufferPtr;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tmpHalfBuffer;
  uint chan;
  int tmpHalfBufferElements;
  unsigned_short *currAcComp;
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> currDcComp;
  half halfCoef [64];
  half halfZigCoef [64];
  int numBlocksY;
  int numBlocksX;
  unsigned_short in_stack_fffffffffffffd28;
  unsigned_short in_stack_fffffffffffffd2a;
  half in_stack_fffffffffffffd2c;
  half in_stack_fffffffffffffd2e;
  char **in_stack_fffffffffffffd30;
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  *in_stack_fffffffffffffd38;
  allocator_type *in_stack_fffffffffffffd40;
  LossyDctEncoderBase *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  half in_stack_fffffffffffffd54;
  undefined2 in_stack_fffffffffffffd56;
  int local_210;
  int local_208;
  int local_200;
  uint local_1fc;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  uint local_1dc;
  undefined6 in_stack_fffffffffffffe30;
  unsigned_short in_stack_fffffffffffffe36;
  ushort in_stack_fffffffffffffe38;
  half in_stack_fffffffffffffe3a;
  int iVar16;
  uint uVar17;
  half local_1b6;
  half local_1b4;
  half local_1b2;
  float local_1b0;
  half local_1aa;
  float local_1a8;
  int local_1a4;
  reference local_1a0;
  value_type local_198;
  float local_18c;
  int local_188;
  uint local_184;
  reference local_180;
  float *in_stack_fffffffffffffe88;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_170;
  uint local_158;
  int local_154;
  undefined8 local_150;
  vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> local_130;
  unsigned_short local_118 [64];
  half local_98 [68];
  int local_10;
  int local_c;
  
  dVar15 = std::ceil((double)CONCAT44((int)((ulong)in_XMM0_Qa >> 0x20),
                                      (float)*(int *)(in_RDI + 0xc) * 0.125));
  local_c = (int)SUB84(dVar15,0);
  dVar15 = std::ceil((double)CONCAT44((int)((ulong)dVar15 >> 0x20),
                                      (float)*(int *)(in_RDI + 0x10) * 0.125));
  local_10 = (int)SUB84(dVar15,0);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          *)(in_RDI + 0x28));
  std::allocator<unsigned_short_*>::allocator((allocator<unsigned_short_*> *)0x2547f1);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::vector
            ((vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> *)
             CONCAT26(in_stack_fffffffffffffd56,
                      CONCAT24(in_stack_fffffffffffffd54._h,in_stack_fffffffffffffd50)),
             (size_type)in_stack_fffffffffffffd48,(allocator_type *)in_stack_fffffffffffffd40);
  std::allocator<unsigned_short_*>::~allocator((allocator<unsigned_short_*> *)0x25481d);
  local_150 = *(undefined8 *)(in_RDI + 0x70);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
          *)(in_RDI + 0x28));
  std::
  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ::resize((vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
            *)CONCAT26(in_stack_fffffffffffffd56,
                       CONCAT24(in_stack_fffffffffffffd54._h,in_stack_fffffffffffffd50)),
           (size_type)in_stack_fffffffffffffd48);
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x24) = 0;
  local_154 = 0;
  for (local_158 = 0; uVar4 = (ulong)local_158,
      sVar5 = std::
              vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      *)(in_RDI + 0x28)), uVar4 < sVar5; local_158 = local_158 + 1) {
    pvVar6 = std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::operator[]
                       ((vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *)
                        (in_RDI + 0x40),(ulong)local_158);
    if (*pvVar6 == FLOAT) {
      local_154 = *(int *)(in_RDI + 0xc) * *(int *)(in_RDI + 0x10) + local_154;
    }
  }
  std::allocator<unsigned_short>::allocator((allocator<unsigned_short> *)0x254975);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT26(in_stack_fffffffffffffd56,
                      CONCAT24(in_stack_fffffffffffffd54._h,in_stack_fffffffffffffd50)),
             (size_type)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::allocator<unsigned_short>::~allocator((allocator<unsigned_short> *)0x2549a1);
  local_180 = (reference)0x0;
  if (local_154 != 0) {
    local_180 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          (&local_170,0);
  }
  for (local_184 = 0; uVar4 = (ulong)local_184,
      sVar5 = std::
              vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      *)(in_RDI + 0x28)), uVar4 < sVar5; local_184 = local_184 + 1) {
    pvVar6 = std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::operator[]
                       ((vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *)
                        (in_RDI + 0x40),(ulong)local_184);
    if (*pvVar6 == FLOAT) {
      for (local_188 = 0; local_188 < *(int *)(in_RDI + 0x10); local_188 = local_188 + 1) {
        local_18c = 0.0;
        pvVar7 = std::
                 vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ::operator[]((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                               *)(in_RDI + 0x28),(ulong)local_184);
        ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (pvVar7,(long)local_188);
        local_198 = *ppcVar8;
        local_1a0 = local_180;
        for (local_1a4 = 0; pvVar3 = local_180, local_1a4 < *(int *)(in_RDI + 0xc);
            local_1a4 = local_1a4 + 1) {
          Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                    (in_stack_fffffffffffffd30,
                     (float *)CONCAT26(in_stack_fffffffffffffd2e._h,
                                       CONCAT24(in_stack_fffffffffffffd2c._h,
                                                CONCAT22(in_stack_fffffffffffffd2a,
                                                         in_stack_fffffffffffffd28))));
          local_1aa = std::numeric_limits<half>::max();
          local_1a8 = half::operator_cast_to_float(&local_1aa);
          pfVar9 = std::min<float>(&local_1a8,&local_18c);
          local_1b4 = std::numeric_limits<half>::max();
          local_1b2 = half::operator-(&local_1b4);
          local_1b0 = half::operator_cast_to_float(&local_1b2);
          pfVar9 = std::max<float>(pfVar9,&local_1b0);
          local_18c = *pfVar9;
          half::half((half *)in_stack_fffffffffffffd40,
                     (float)((ulong)in_stack_fffffffffffffd38 >> 0x20));
          half::bits(&local_1b6);
          Xdr::write<Imf_2_5::CharPtrIO,char*>
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2e._h);
        }
        pvVar7 = std::
                 vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 ::operator[]((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                               *)(in_RDI + 0x28),(ulong)local_184);
        ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (pvVar7,(long)local_188);
        *ppcVar8 = (value_type)pvVar3;
        local_180 = local_180 + *(int *)(in_RDI + 0xc);
      }
    }
  }
  puVar1 = *(value_type *)(in_RDI + 0x78);
  ppuVar10 = std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::operator[]
                       (&local_130,0);
  *ppuVar10 = puVar1;
  for (uVar17 = 1; uVar4 = (ulong)uVar17,
      sVar5 = std::
              vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      *)(in_RDI + 0x28)), uVar4 < sVar5; uVar17 = uVar17 + 1) {
    ppuVar10 = std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::operator[]
                         (&local_130,(ulong)(uVar17 - 1));
    puVar1 = *ppuVar10;
    iVar13 = local_c * local_10;
    ppuVar10 = std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::operator[]
                         (&local_130,(ulong)uVar17);
    *ppuVar10 = puVar1 + iVar13;
  }
  for (iVar13 = 0; iVar13 < local_10; iVar13 = iVar13 + 1) {
    for (iVar16 = 0; iVar16 < local_c; iVar16 = iVar16 + 1) {
      for (local_1dc = 0;
          sVar5 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                          *)(in_RDI + 0x28)), local_1dc < sVar5; local_1dc = local_1dc + 1) {
        for (local_1e0 = 0; local_1e0 < 8; local_1e0 = local_1e0 + 1) {
          for (local_1e4 = 0; local_1e4 < 8; local_1e4 = local_1e4 + 1) {
            local_1e8 = iVar16 * 8 + local_1e4;
            local_1ec = iVar13 * 8 + local_1e0;
            if (*(int *)(in_RDI + 0xc) <= local_1e8) {
              local_1e8 = *(int *)(in_RDI + 0xc) - (local_1e8 - (*(int *)(in_RDI + 0xc) + -1));
            }
            if (local_1e8 < 0) {
              local_1e8 = *(int *)(in_RDI + 0xc) + -1;
            }
            if (*(int *)(in_RDI + 0x10) <= local_1ec) {
              local_1ec = *(int *)(in_RDI + 0x10) - (local_1ec - (*(int *)(in_RDI + 0x10) + -1));
            }
            if (local_1ec < 0) {
              local_1ec = *(int *)(in_RDI + 0x10) + -1;
            }
            pvVar7 = std::
                     vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ::operator[]((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                   *)(in_RDI + 0x28),(ulong)local_1dc);
            ppcVar8 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (pvVar7,(long)local_1ec);
            in_stack_fffffffffffffe38 = *(ushort *)(*ppcVar8 + (long)local_1e8 * 2);
            if (*(long *)(in_RDI + 0x18) == 0) {
              Xdr::read<Imf_2_5::CharPtrIO,char_const*>
                        (in_stack_fffffffffffffd30,
                         (unsigned_short *)
                         CONCAT26(in_stack_fffffffffffffd2e._h,
                                  CONCAT24(in_stack_fffffffffffffd2c._h,
                                           CONCAT22(in_stack_fffffffffffffd2a,
                                                    in_stack_fffffffffffffd28))));
              half::setBits((half *)&stack0xfffffffffffffe3a,in_stack_fffffffffffffe36);
            }
            else {
              half::setBits((half *)&stack0xfffffffffffffe3a,
                            *(unsigned_short *)
                             (*(long *)(in_RDI + 0x18) + (ulong)in_stack_fffffffffffffe38 * 2));
            }
            fVar14 = half::operator_cast_to_float((half *)&stack0xfffffffffffffe3a);
            in_stack_fffffffffffffd54._h = SUB42(fVar14,0);
            in_stack_fffffffffffffd56 = (undefined2)((uint)fVar14 >> 0x10);
            pvVar11 = std::
                      vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                      ::operator[]((vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                                    *)(in_RDI + 0x58),(ulong)local_1dc);
            pvVar11->_buffer[local_1e0 * 8 + local_1e4] =
                 (float)CONCAT22(in_stack_fffffffffffffd56,in_stack_fffffffffffffd54._h);
          }
        }
      }
      sVar5 = std::
              vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
              ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      *)(in_RDI + 0x28));
      if (sVar5 == 3) {
        in_stack_fffffffffffffd38 =
             (vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
              *)(in_RDI + 0x58);
        pvVar11 = std::
                  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                  ::operator[](in_stack_fffffffffffffd38,0);
        in_stack_fffffffffffffd40 = (allocator_type *)pvVar11->_buffer;
        pvVar11 = std::
                  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                  ::operator[](in_stack_fffffffffffffd38,1);
        in_stack_fffffffffffffd48 = (LossyDctEncoderBase *)pvVar11->_buffer;
        pvVar11 = std::
                  vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                  ::operator[](in_stack_fffffffffffffd38,2);
        anon_unknown_9::csc709Forward64
                  ((float *)in_stack_fffffffffffffd40,(float *)in_stack_fffffffffffffd48,
                   pvVar11->_buffer);
      }
      local_1fc = 0;
      while( true ) {
        in_stack_fffffffffffffd30 = (char **)(ulong)local_1fc;
        ppcVar12 = (char **)std::
                            vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                            ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                    *)(in_RDI + 0x28));
        if (ppcVar12 <= in_stack_fffffffffffffd30) break;
        std::
        vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
        ::operator[]((vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                      *)(in_RDI + 0x58),(ulong)local_1fc);
        anon_unknown_9::dctForward8x8(in_stack_fffffffffffffe88);
        if (local_1fc == 0) {
          for (local_200 = 0; local_200 < 0x40; local_200 = local_200 + 1) {
            std::
            vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
            ::operator[]((vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                          *)(in_RDI + 0x58),0);
            half::half((half *)in_stack_fffffffffffffd40,
                       (float)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            in_stack_fffffffffffffd2e =
                 quantize(in_stack_fffffffffffffd48,in_stack_fffffffffffffd54,
                          (float)((ulong)in_stack_fffffffffffffd40 >> 0x20));
            local_118[local_200] = in_stack_fffffffffffffd2e._h;
          }
        }
        else {
          for (local_208 = 0; local_208 < 0x40; local_208 = local_208 + 1) {
            std::
            vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
            ::operator[]((vector<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
                          *)(in_RDI + 0x58),(ulong)local_1fc);
            half::half((half *)in_stack_fffffffffffffd40,
                       (float)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            in_stack_fffffffffffffd2c =
                 quantize(in_stack_fffffffffffffd48,in_stack_fffffffffffffd54,
                          (float)((ulong)in_stack_fffffffffffffd40 >> 0x20));
            local_118[local_208] = in_stack_fffffffffffffd2c._h;
          }
        }
        toZigZag((LossyDctEncoderBase *)CONCAT44(uVar17,iVar13),
                 (half *)CONCAT44(iVar16,CONCAT22(in_stack_fffffffffffffe3a._h,
                                                  in_stack_fffffffffffffe38)),
                 (half *)CONCAT26(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30));
        for (local_210 = 0; local_210 < 0x40; local_210 = local_210 + 1) {
          in_stack_fffffffffffffd2a = half::bits(local_98 + local_210);
          Xdr::write<Imf_2_5::CharPtrIO,char*>
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2e._h);
          half::setBits(local_98 + local_210,in_stack_fffffffffffffe38);
        }
        in_stack_fffffffffffffd28 = half::bits(local_98);
        ppuVar10 = std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::operator[]
                             (&local_130,(ulong)local_1fc);
        puVar2 = *ppuVar10;
        *ppuVar10 = puVar2 + 1;
        *puVar2 = in_stack_fffffffffffffd28;
        *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + 1;
        rleAc((LossyDctEncoderBase *)
              CONCAT26(in_stack_fffffffffffffd56,
                       CONCAT24(in_stack_fffffffffffffd54._h,in_stack_fffffffffffffd50)),
              (half *)in_stack_fffffffffffffd48,(unsigned_short **)in_stack_fffffffffffffd40);
        local_1fc = local_1fc + 1;
      }
    }
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffd40);
  std::vector<unsigned_short_*,_std::allocator<unsigned_short_*>_>::~vector
            ((vector<unsigned_short_*,_std::allocator<unsigned_short_*>_> *)
             in_stack_fffffffffffffd40);
  return;
}

Assistant:

void
DwaCompressor::LossyDctEncoderBase::execute ()
{
    int  numBlocksX   = (int)ceil ((float)_width / 8.0f);
    int  numBlocksY   = (int)ceil ((float)_height/ 8.0f);

    half halfZigCoef[64]; 
    half halfCoef[64];

    std::vector<unsigned short *> currDcComp (_rowPtrs.size());
    unsigned short               *currAcComp = (unsigned short *)_packedAc;

    _dctData.resize (_rowPtrs.size());
    _numAcComp = 0;
    _numDcComp = 0;
 
    assert (_type.size() == _rowPtrs.size());
    assert ((_rowPtrs.size() == 3) || (_rowPtrs.size() == 1));

    // 
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //

    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
        if (_type[chan] == FLOAT)
            tmpHalfBufferElements += _width * _height;

    std::vector<unsigned short> tmpHalfBuffer (tmpHalfBufferElements);

    char *tmpHalfBufferPtr = 0;

    if (tmpHalfBufferElements)
        tmpHalfBufferPtr = (char *)&tmpHalfBuffer[0];

    //
    // Run over all the float scanlines, quantizing, 
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
    {
        if (_type[chan] != FLOAT)
            continue;
    
        for (int y = 0; y < _height; ++y)
        {
            float       src = 0;
            const char *srcXdr = _rowPtrs[chan][y];
            char       *dstXdr = tmpHalfBufferPtr;
           
            for (int x = 0; x < _width; ++x)
            {

                Xdr::read<CharPtrIO> (srcXdr, src);

                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                src = std::max (
                    std::min ((float) std::numeric_limits<half>::max(), src),
                              (float)-std::numeric_limits<half>::max());

                Xdr::write<CharPtrIO> (dstXdr, ((half)src).bits());

                //
                // Xdr::read and Xdr::write will advance the ptr
                //
            }

            _rowPtrs[chan][y] = (const char *)tmpHalfBufferPtr;
            tmpHalfBufferPtr += _width * sizeof (unsigned short);
        }
    }

    //
    // Pack DC components together by common plane, so we can get 
    // a little more out of differencing them. We'll always have 
    // one component per block, so we can computed offsets.
    //

    currDcComp[0] = (unsigned short *)_packedDc;

    for (unsigned int chan = 1; chan < _rowPtrs.size(); ++chan)
        currDcComp[chan] = currDcComp[chan-1] + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            half           h;
            unsigned short tmpShortXdr, tmpShortNative;
            char          *tmpCharPtr;

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= _width)
                            vx = _width - (vx - (_width - 1));
                        
                        if (vx < 0) vx = _width-1;

                        if (vy >=_height)
                            vy = _height - (vy - (_height - 1));

                        if (vy < 0) vy = _height-1;
                    
                        tmpShortXdr =
                            ((const unsigned short *)(_rowPtrs[chan])[vy])[vx];

                        if (_toNonlinear)
                        {
                            h.setBits (_toNonlinear[tmpShortXdr]);
                        }
                        else
                        {
                            const char *tmpConstCharPtr =
                                (const char *)(&tmpShortXdr);

                            Xdr::read<CharPtrIO>
                                (tmpConstCharPtr, tmpShortNative);

                            h.setBits(tmpShortNative);
                        }

                        _dctData[chan]._buffer[y * 8 + x] = (float)h;
                    } // x
                } // y
            } // chan

            //
            // Color space conversion
            //

            if (_rowPtrs.size() == 3)
            {
                csc709Forward64 (_dctData[0]._buffer, 
                                 _dctData[1]._buffer, 
                                 _dctData[2]._buffer);
            }

            for (unsigned int chan = 0; chan < _rowPtrs.size(); ++chan)
            {
                //
                // Forward DCT
                //

                dctForward8x8(_dctData[chan]._buffer);

                //
                // Quantize to half, and zigzag
                //

                if (chan == 0)
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableY[i]);
                    }
                }
                else
                {
                    for (int i = 0; i < 64; ++i)
                    {
                        halfCoef[i] =
                            quantize ((half)_dctData[chan]._buffer[i],
                                      _quantBaseError*_quantTableCbCr[i]);
                    }
                }

                toZigZag (halfZigCoef, halfCoef);
                
                //
                // Convert from NATIVE back to XDR, before we write out
                //

                for (int i = 0; i < 64; ++i)
                {
                    tmpCharPtr = (char *)&tmpShortXdr;
                    Xdr::write<CharPtrIO>(tmpCharPtr, halfZigCoef[i].bits());
                    halfZigCoef[i].setBits(tmpShortXdr);
                }

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *currDcComp[chan]++ = halfZigCoef[0].bits();
                _numDcComp++;
                
                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                rleAc (halfZigCoef, currAcComp);
            } // chan
        } // blockx
    } // blocky              
}